

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdf.h
# Opt level: O3

vec3 * __thiscall cosine_pdf::generate(vec3 *__return_storage_ptr__,cosine_pdf *this)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  int iVar5;
  int iVar6;
  double local_58;
  vec3 local_28;
  
  iVar5 = rand();
  iVar6 = rand();
  dVar1 = (double)iVar6 * 4.656612873077393e-10;
  dVar2 = (double)iVar5 * 4.656612873077393e-10 * 6.283185307179586;
  dVar3 = cos(dVar2);
  local_58 = SQRT(dVar1);
  dVar4 = local_58;
  if (dVar1 < 0.0) {
    dVar4 = sqrt(dVar1);
  }
  dVar2 = sin(dVar2);
  if (dVar1 < 0.0) {
    local_58 = sqrt(dVar1);
  }
  dVar1 = 1.0 - dVar1;
  if (dVar1 < 0.0) {
    local_28.e[2] = sqrt(dVar1);
  }
  else {
    local_28.e[2] = SQRT(dVar1);
  }
  local_28.e[0] = dVar4 * dVar3;
  local_28.e[1] = local_58 * dVar2;
  onb::transform(&this->uvw,&local_28);
  return __return_storage_ptr__;
}

Assistant:

vec3 generate() const override {
        return uvw.transform(random_cosine_direction());
    }